

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

bool __thiscall clickhouse::Client::Impl::ReceiveHello(Impl *this)

{
  bool bVar1;
  string *in_RDI;
  uint64_t packet_type;
  bool in_stack_00000067;
  Impl *in_stack_00000068;
  uint64_t *in_stack_ffffffffffffffd8;
  CodedInputStream *input;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  input = (CodedInputStream *)0x0;
  bVar1 = CodedInputStream::ReadVarint64
                    ((CodedInputStream *)
                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     (uint64_t *)in_RDI);
  if (bVar1) {
    if (input == (CodedInputStream *)0x0) {
      bVar1 = WireFormat::ReadString((CodedInputStream *)0x0,in_RDI);
      if (bVar1) {
        bVar1 = WireFormat::ReadUInt64((CodedInputStream *)in_RDI,in_stack_ffffffffffffffd8);
        if (bVar1) {
          bVar1 = WireFormat::ReadUInt64((CodedInputStream *)in_RDI,in_stack_ffffffffffffffd8);
          if (bVar1) {
            bVar1 = WireFormat::ReadUInt64((CodedInputStream *)in_RDI,in_stack_ffffffffffffffd8);
            if (bVar1) {
              if ((in_RDI[0x11].field_2._M_allocated_capacity < 0xd32a) ||
                 (bVar1 = WireFormat::ReadString(input,in_RDI), bVar1)) {
                if ((in_RDI[0x11].field_2._M_allocated_capacity < 0xd464) ||
                   (bVar1 = WireFormat::ReadString(input,in_RDI), bVar1)) {
                  if (in_RDI[0x11].field_2._M_allocated_capacity < 0xd481) {
                    in_RDI[0x11]._M_string_length = in_RDI[0x11].field_2._M_allocated_capacity;
                  }
                  else {
                    bVar1 = WireFormat::ReadUInt64
                                      ((CodedInputStream *)in_RDI,in_stack_ffffffffffffffd8);
                    if (!bVar1) {
                      return false;
                    }
                  }
                  bVar1 = true;
                }
                else {
                  bVar1 = false;
                }
              }
              else {
                bVar1 = false;
              }
            }
            else {
              bVar1 = false;
            }
          }
          else {
            bVar1 = false;
          }
        }
        else {
          bVar1 = false;
        }
      }
      else {
        bVar1 = false;
      }
    }
    else if (input == (CodedInputStream *)0x2) {
      ReceiveException(in_stack_00000068,in_stack_00000067);
      bVar1 = false;
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Client::Impl::ReceiveHello() {
    uint64_t packet_type = 0;

    if (!input_.ReadVarint64(&packet_type)) {
        return false;
    }

    if (packet_type == ServerCodes::Hello) {
        if (!WireFormat::ReadString(&input_, &server_info_.name)) {
            return false;
        }
        if (!WireFormat::ReadUInt64(&input_, &server_info_.version_major)) {
            return false;
        }
        if (!WireFormat::ReadUInt64(&input_, &server_info_.version_minor)) {
            return false;
        }
        if (!WireFormat::ReadUInt64(&input_, &server_info_.revision)) {
            return false;
        }

        if (server_info_.revision >= DBMS_MIN_REVISION_WITH_SERVER_TIMEZONE) {
            if (!WireFormat::ReadString(&input_, &server_info_.timezone)) {
                return false;
            }
        }
        if (server_info_.revision >= DBMS_MIN_REVISION_WITH_SERVER_DISPLAY_NAME) {
            if (!WireFormat::ReadString(&input_, &server_info_.display_name)) {
                return false;
            }
        }
        if (server_info_.revision >= DBMS_MIN_REVISION_WITH_VERSION_PATCH) {
            if (!WireFormat::ReadUInt64(&input_, &server_info_.version_patch)) {
                return false;
            }
        } else {
            server_info_.version_patch = server_info_.revision;
        }

        return true;
    } else if (packet_type == ServerCodes::Exception) {
        ReceiveException(true);
        return false;
    }

    return false;
}